

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::AllocateOptionsImpl<google::protobuf::OneofDescriptor>
          (DescriptorBuilder *this,string *name_scope,string *element_name,OptionsType *orig_options
          ,OneofDescriptor *descriptor)

{
  OneofOptions *this_00;
  OptionsToInterpret local_80;
  
  this_00 = DescriptorPool::Tables::AllocateMessage<google::protobuf::OneofOptions>
                      (this->tables_,(OneofOptions *)0x0);
  MessageLite::SerializeAsString_abi_cxx11_(&local_80.name_scope,(MessageLite *)orig_options);
  MessageLite::ParseFromString((MessageLite *)this_00,&local_80.name_scope);
  std::__cxx11::string::~string((string *)&local_80);
  *(OneofOptions **)(descriptor + 0x28) = this_00;
  if (0 < (this_00->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_) {
    anon_unknown_1::OptionsToInterpret::OptionsToInterpret
              (&local_80,name_scope,element_name,&orig_options->super_Message,
               &this_00->super_Message);
    std::
    vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
    ::push_back(&this->options_to_interpret_,&local_80);
    anon_unknown_1::OptionsToInterpret::~OptionsToInterpret(&local_80);
  }
  return;
}

Assistant:

void DescriptorBuilder::AllocateOptionsImpl(
    const string& name_scope,
    const string& element_name,
    const typename DescriptorT::OptionsType& orig_options,
    DescriptorT* descriptor) {
  // We need to use a dummy pointer to work around a bug in older versions of
  // GCC.  Otherwise, the following two lines could be replaced with:
  //   typename DescriptorT::OptionsType* options =
  //       tables_->AllocateMessage<typename DescriptorT::OptionsType>();
  typename DescriptorT::OptionsType* const dummy = NULL;
  typename DescriptorT::OptionsType* options = tables_->AllocateMessage(dummy);
  // Avoid using MergeFrom()/CopyFrom() in this class to make it -fno-rtti
  // friendly. Without RTTI, MergeFrom() and CopyFrom() will fallback to the
  // reflection based method, which requires the Descriptor. However, we are in
  // the middle of building the descriptors, thus the deadlock.
  options->ParseFromString(orig_options.SerializeAsString());
  descriptor->options_ = options;

  // Don't add to options_to_interpret_ unless there were uninterpreted
  // options.  This not only avoids unnecessary work, but prevents a
  // bootstrapping problem when building descriptors for descriptor.proto.
  // descriptor.proto does not contain any uninterpreted options, but
  // attempting to interpret options anyway will cause
  // OptionsType::GetDescriptor() to be called which may then deadlock since
  // we're still trying to build it.
  if (options->uninterpreted_option_size() > 0) {
    options_to_interpret_.push_back(
        OptionsToInterpret(name_scope, element_name, &orig_options, options));
  }
}